

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void selectSource(atom *theAtoms,pattern *srcPat,int srcFlag,pattern *targPat,int targFlg,
                 pattern *ignorePat)

{
  int iVar1;
  atom *src;
  
  if (theAtoms != (atom *)0x0) {
    do {
      if (((DoHet != '\x01') || ((theAtoms->props & 0x800) == 0)) &&
         ((DoH2O != '\x01' || ((theAtoms->props & 0x400) == 0)))) {
        if ((srcPat != (pattern *)0x0) && (iVar1 = matchPat(theAtoms,srcPat), iVar1 != 0)) {
          theAtoms->flags = theAtoms->flags | srcFlag;
        }
        if ((targPat != (pattern *)0x0) && (iVar1 = matchPat(theAtoms,targPat), iVar1 != 0)) {
          theAtoms->flags = theAtoms->flags | targFlg;
        }
        if ((ignorePat != (pattern *)0x0) && (iVar1 = matchPat(theAtoms,ignorePat), iVar1 != 0)) {
          theAtoms->flags = 4;
        }
      }
      theAtoms = theAtoms->next;
    } while (theAtoms != (atom_t *)0x0);
  }
  return;
}

Assistant:

void selectSource(atom *theAtoms, pattern *srcPat, int srcFlag,
		  pattern *targPat, int targFlg, pattern *ignorePat)
{
   atom *src = NULL;

   for(src = theAtoms; src; src = src->next)
   {
      if(   (DoHet || ! (src->props &   HET_PROP) )
         && (DoH2O || ! (src->props & WATER_PROP) ) )
      {
         /*060212 hets marked as prot,dna,rna could be excluded by these tests*/
         /* if src||target was specified as not-prot,dna,rna,... */
         /* seemingly because atoms of hets are also assigned those types */
	 if (srcPat && matchPat(src,  srcPat)) { src->flags |= srcFlag; }
	 if(targPat && matchPat(src, targPat)) { src->flags |= targFlg; }

	 /*if ((FABS(src->occ) <= OccupancyCutoff)        */
	 /*   || (ignorePat && matchPat(src, ignorePat))) */
         /*050119 not use occ cutoff here, so 0-occ atom will be put into bins*/
	 if (ignorePat && matchPat(src, ignorePat))
         {
	    src->flags = IGNORE_FLAG; /* overwrite any other settings */
            /*050118 this seems the only place that sets IGNORE_FLAG*/
	 }
      }
   }
}